

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall
cppforth::Forth::restoreInput
          (Forth *this,structSavedInput *save,bool emptyCurrentBuffer,bool restoreNextCommand)

{
  bool restoreNextCommand_local;
  bool emptyCurrentBuffer_local;
  structSavedInput *save_local;
  Forth *this_local;
  
  if (-1 < save->SourceDashId_) {
    if (emptyCurrentBuffer) {
      std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                (&save->inputBufferStrings_,&this->inputBufferStrings);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->inputBufferStrings,&save->inputBufferStrings_);
    }
    this->inputBufferStringsCurrent = save->inputBufferStringsCurrent_;
    if (save->blk == 0) {
      setSourceBuffer(this);
    }
  }
  setSourceVariables(this,save->SourceBufferAddress_,save->SourceBufferSize_,
                     save->SourceBufferOffset_);
  setSourceId(this,save->SourceDashId_);
  setDataCell(this,this->VarOffsetBlkAddress,save->blk);
  this->InterpretState = save->interpretState_;
  if (restoreNextCommand) {
    this->next_command = save->next_;
  }
  return;
}

Assistant:

void restoreInput(struct structSavedInput& save, bool emptyCurrentBuffer, bool restoreNextCommand) {
			if(save.SourceDashId_>=0 ){
				if (emptyCurrentBuffer) {
					std::swap(save.inputBufferStrings_, inputBufferStrings);
				}
				else {
					inputBufferStrings=save.inputBufferStrings_;
				}
				inputBufferStringsCurrent = save.inputBufferStringsCurrent_;
				// is restored from block (LOAD)
				if (save.blk == 0) {
					setSourceBuffer();
				}
			}
			setSourceVariables(save.SourceBufferAddress_, save.SourceBufferSize_, save.SourceBufferOffset_);
			setSourceId(save.SourceDashId_);
			setDataCell(VarOffsetBlkAddress, save.blk);
			InterpretState = save.interpretState_;
			// restoree next command for evaluate
			// do not need restore for RESTORE-INPUT
			if (restoreNextCommand) {
				next_command = save.next_;
			}
		}